

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

void Js::JavascriptString::SearchValueHelper
               (ScriptContext *scriptContext,Var aValue,JavascriptRegExp **ppSearchRegEx,
               JavascriptString **ppSearchString)

{
  bool bVar1;
  ScriptConfiguration *this;
  JavascriptRegExp *pJVar2;
  JavascriptString *pJVar3;
  JavascriptString **ppSearchString_local;
  JavascriptRegExp **ppSearchRegEx_local;
  Var aValue_local;
  ScriptContext *scriptContext_local;
  
  *ppSearchRegEx = (JavascriptRegExp *)0x0;
  *ppSearchString = (JavascriptString *)0x0;
  this = ScriptContext::GetConfig(scriptContext);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
  if ((bVar1) || (bVar1 = VarIs<Js::JavascriptRegExp>(aValue), !bVar1)) {
    bVar1 = VarIs<Js::JavascriptString>(aValue);
    if (bVar1) {
      pJVar3 = VarTo<Js::JavascriptString>(aValue);
      *ppSearchString = pJVar3;
    }
    else {
      pJVar3 = JavascriptConversion::ToString(aValue,scriptContext);
      *ppSearchString = pJVar3;
    }
  }
  else {
    pJVar2 = VarTo<Js::JavascriptRegExp>(aValue);
    *ppSearchRegEx = pJVar2;
  }
  return;
}

Assistant:

void JavascriptString::SearchValueHelper(ScriptContext* scriptContext, Var aValue, JavascriptRegExp ** ppSearchRegEx, JavascriptString ** ppSearchString)
    {
        *ppSearchRegEx = nullptr;
        *ppSearchString = nullptr;

        // When the config is enabled, the operation is handled by a Symbol function (e.g. Symbol.replace).
        if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled()
            && VarIs<JavascriptRegExp>(aValue))
        {
            *ppSearchRegEx = VarTo<JavascriptRegExp>(aValue);
        }
        else if (VarIs<JavascriptString>(aValue))
        {
            *ppSearchString = VarTo<JavascriptString>(aValue);
        }
        else
        {
            *ppSearchString = JavascriptConversion::ToString(aValue, scriptContext);
        }
    }